

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O1

bool iDynTree::exportTransform(Transform *trans,xmlNodePtr parent_element)

{
  bool bVar1;
  undefined8 uVar2;
  Position *in;
  string pose_rpy_str;
  string pose_xyz_str;
  Vector3 pose_rpy;
  string local_80;
  string local_60;
  VectorFixSize<3U> local_40;
  
  uVar2 = xmlNewChild(parent_element,0,"origin",0);
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  in = (Position *)iDynTree::Transform::getPosition();
  bVar1 = vectorToString<iDynTree::Position>(in,&local_60);
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  iDynTree::Transform::getRotation();
  iDynTree::Rotation::asRPY();
  if (bVar1) {
    bVar1 = vectorToString<iDynTree::VectorFixSize<3u>>(&local_40,&local_80);
  }
  else {
    bVar1 = false;
  }
  xmlNewProp(uVar2,"xyz",local_60._M_dataplus._M_p);
  xmlNewProp(uVar2,"rpy",local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool exportTransform(const Transform &trans, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr origin = xmlNewChild(parent_element, NULL, BAD_CAST "origin", NULL);
    std::string pose_xyz_str;
    ok = ok && vectorToString(trans.getPosition(), pose_xyz_str);
    std::string pose_rpy_str;
    Vector3 pose_rpy = trans.getRotation().asRPY();
    ok = ok && vectorToString(pose_rpy, pose_rpy_str);
    xmlNewProp(origin, BAD_CAST "xyz", BAD_CAST pose_xyz_str.c_str());
    xmlNewProp(origin, BAD_CAST "rpy", BAD_CAST pose_rpy_str.c_str());
    return ok;
}